

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_CDPlay(SDL12_CD *cdrom,int start,int length)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  SDL12_CD *cdrom_00;
  Uint32 ntracks;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  Uint32 *pUVar7;
  uint uVar8;
  
  cdrom_00 = ValidCDDevice(cdrom);
  if (cdrom_00 == (SDL12_CD *)0x0) {
    return -1;
  }
  if (cdrom_00->status == SDL12_CD_TRAYEMPTY) {
    pcVar6 = "Tray empty";
  }
  else {
    if (-1 < start) {
      if (length < 0) {
        pcVar6 = "Invalid length";
        goto LAB_00112932;
      }
      uVar2 = cdrom_00->numtracks;
      lVar5 = 0;
      uVar4 = 0;
      if (0 < (int)uVar2) {
        uVar4 = (ulong)uVar2;
      }
      pUVar7 = &cdrom_00->track[1].length;
      for (; -lVar5 != uVar4; lVar5 = lVar5 + -1) {
        if ((pUVar7[-2] <= (uint)start) && ((uint)start < pUVar7[-2] + pUVar7[-3])) {
          puVar1 = pUVar7 + -2;
          uVar8 = pUVar7[-3] - (start - *puVar1);
          ntracks = 0;
          if ((uint)length < uVar8) goto LAB_0011299b;
          uVar4 = 1 - lVar5;
          ntracks = 1;
          length = length - uVar8;
          goto LAB_00112961;
        }
        pUVar7 = pUVar7 + 3;
      }
    }
    pcVar6 = "Invalid start";
  }
LAB_00112932:
  iVar3 = (*SDL20_SetError)(pcVar6);
  return iVar3;
LAB_00112961:
  if ((int)uVar2 <= (int)uVar4) {
    if (length == 0) {
      length = 0xffffffff;
      ntracks = length;
    }
    else {
      length = cdrom_00->track[(long)(int)uVar2 + -1].length;
      ntracks = (uVar2 + (int)lVar5) - 1;
    }
LAB_0011299b:
    iVar3 = StartCDAudioPlaying(cdrom_00,-(int)lVar5,start - *puVar1,ntracks,length);
    return iVar3;
  }
  uVar8 = *pUVar7;
  if ((uint)length < *pUVar7) goto LAB_0011299b;
  pUVar7 = pUVar7 + 3;
  ntracks = ntracks + 1;
  uVar4 = (ulong)((int)uVar4 + 1);
  length = length - uVar8;
  goto LAB_00112961;
}

Assistant:

SDLCALL
SDL_CDPlay(SDL12_CD *cdrom, int start, int length)
{
    const Uint32 ui32start = (Uint32) start;
    Uint32 remain = (Uint32) length;
    int start_track = -1;
    int start_frame = -1;
    int ntracks = -1;
    int nframes = -1;
    int i;

    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }
    if (start < 0) {
        return SDL20_SetError("Invalid start");
    }
    if (length < 0) {
        return SDL20_SetError("Invalid length");
    }

    for (i = 0; i < cdrom->numtracks; i++) {
        if ((ui32start >= cdrom->track[i].offset) && (ui32start < (cdrom->track[i].offset + cdrom->track[i].length))) {
            start_track = i;
            break;
        }
    }

    if (start_track == -1) {
        return SDL20_SetError("Invalid start");
    }

    start_frame = start - cdrom->track[start_track].offset;

    if (remain < (cdrom->track[start_track].length - start_frame)) {
        ntracks = 0;
        nframes = remain;
        remain = 0;
    } else {
        remain -= (cdrom->track[start_track].length - start_frame);
        for (i = start_track + 1; i < cdrom->numtracks; i++) {
            if (remain < cdrom->track[i].length) {
                ntracks = i - start_track;
                nframes = remain;
                remain = 0;
                break;
            }
            remain -= cdrom->track[i].length;
        }
    }

    if (remain) {
        ntracks = (cdrom->numtracks - start_track) - 1;
        nframes = cdrom->track[cdrom->numtracks - 1].length;
    }

    return StartCDAudioPlaying(cdrom, start_track, start_frame, ntracks, nframes);
}